

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

int verify_descriptor_combo(miniscript_node_t *node,miniscript_node_t *parent)

{
  _Bool _Var1;
  miniscript_node_t *parent_local;
  miniscript_node_t *node_local;
  
  if (parent == (miniscript_node_t *)0x0) {
    _Var1 = has_uncompressed_key_by_child(node);
    if (_Var1) {
      node_local._4_4_ = verify_descriptor_pkh(node,(miniscript_node_t *)0x0);
    }
    else {
      node_local._4_4_ = verify_descriptor_wpkh(node,(miniscript_node_t *)0x0);
    }
  }
  else {
    node_local._4_4_ = -2;
  }
  return node_local._4_4_;
}

Assistant:

static int verify_descriptor_combo(struct miniscript_node_t *node, struct miniscript_node_t *parent)
{
    if (parent)
        return WALLY_EINVAL;

    /* Since the combo is of multiple return types, the return value is wpkh or pkh. */
    if (has_uncompressed_key_by_child(node)) {
        return verify_descriptor_pkh(node, parent);
    } else {
        return verify_descriptor_wpkh(node, parent);
    }
}